

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

void __thiscall
Js::DynamicObject::InitSlots
          (DynamicObject *this,DynamicObject *instance,ScriptContext *scriptContext)

{
  uint16 uVar1;
  DynamicTypeHandler *pDVar2;
  Recycler *pRVar3;
  WriteBarrierPtr<void> *ptr;
  TrackAllocData local_58;
  uint local_30;
  int local_2c;
  int inlineSlotCapacity;
  int slotCapacity;
  Recycler *recycler;
  ScriptContext *scriptContext_local;
  DynamicObject *instance_local;
  DynamicObject *this_local;
  
  recycler = (Recycler *)scriptContext;
  scriptContext_local = (ScriptContext *)instance;
  instance_local = this;
  _inlineSlotCapacity = ScriptContext::GetRecycler(scriptContext);
  pDVar2 = GetTypeHandler(this);
  local_2c = DynamicTypeHandler::GetSlotCapacity(pDVar2);
  pDVar2 = GetTypeHandler(this);
  uVar1 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar2);
  pRVar3 = _inlineSlotCapacity;
  local_30 = (uint)uVar1;
  if ((int)local_30 < local_2c) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
               (long)(int)(local_2c - local_30),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
               ,0xd4);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
    ptr = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                    ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocZero,0,
                     (long)(int)(local_2c - local_30));
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
              ((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)
               &(scriptContext_local->super_ScriptContextBase).globalObject,ptr);
  }
  return;
}

Assistant:

void DynamicObject::InitSlots(DynamicObject * instance, ScriptContext * scriptContext)
    {
        Recycler * recycler = scriptContext->GetRecycler();
        int slotCapacity = GetTypeHandler()->GetSlotCapacity();
        int inlineSlotCapacity = GetTypeHandler()->GetInlineSlotCapacity();
        if (slotCapacity > inlineSlotCapacity)
        {
            instance->auxSlots = RecyclerNewArrayZ(recycler, Field(Var), slotCapacity - inlineSlotCapacity);
        }
    }